

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O2

base_learner * multilabel_oaa_setup(options_i *options,vw *all)

{
  int iVar1;
  base_learner *l;
  single_learner *base;
  learner<multi_oaa,_example> *plVar2;
  long lVar3;
  undefined **ppuVar4;
  label_parser *plVar5;
  byte bVar6;
  allocator local_162;
  allocator local_161;
  free_ptr<multi_oaa> data;
  string local_150 [32];
  string local_130;
  string local_110;
  option_group_definition new_options;
  undefined1 local_b8 [112];
  bool local_48;
  
  bVar6 = 0;
  scoped_calloc_or_throw<multi_oaa>();
  std::__cxx11::string::string
            ((string *)&local_110,"Multilabel One Against All",(allocator *)local_b8);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_130,"multilabel_oaa",&local_161);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_b8,&local_130,
             &(data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_multi_oaa_*,_false>._M_head_impl)->k);
  local_48 = true;
  std::__cxx11::string::string(local_150,"One-against-all multilabel with <k> labels",&local_162);
  std::__cxx11::string::_M_assign((string *)(local_b8 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&new_options,(typed_option<unsigned_long> *)local_b8);
  std::__cxx11::string::~string(local_150);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_b8);
  std::__cxx11::string::~string((string *)&local_130);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)local_b8,"multilabel_oaa",(allocator *)local_150);
  iVar1 = (*options->_vptr_options_i[1])(options,local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<multi_oaa,_example> *)0x0;
  }
  else {
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::learner<multi_oaa,example>::init_learner<LEARNER::learner<char,example>>
                       (data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_multi_oaa_*,_false>._M_head_impl,base,
                        predict_or_learn<true>,predict_or_learn<false>,
                        (data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_multi_oaa_*,_false>._M_head_impl)->k,multilabels);
    data._M_t.super___uniq_ptr_impl<multi_oaa,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_multi_oaa_*,_void_(*)(void_*)>.super__Head_base<0UL,_multi_oaa_*,_false>.
    _M_head_impl = (multi_oaa *)0x0;
    *(undefined8 *)(plVar2 + 0x58) = *(undefined8 *)(plVar2 + 0x18);
    *(code **)(plVar2 + 0x68) = finish_example;
    ppuVar4 = &MULTILABEL::multilabel;
    plVar5 = &all->p->lp;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      plVar5->default_label = (_func_void_void_ptr *)*ppuVar4;
      ppuVar4 = ppuVar4 + (ulong)bVar6 * -2 + 1;
      plVar5 = (label_parser *)((long)plVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    all->label_type = multi;
    all->delete_prediction = (_func_void_void_ptr *)PTR_delete_label_002b2b30;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<multi_oaa,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar2;
}

Assistant:

LEARNER::base_learner* multilabel_oaa_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<multi_oaa>();
  option_group_definition new_options("Multilabel One Against All");
  new_options.add(make_option("multilabel_oaa", data->k).keep().help("One-against-all multilabel with <k> labels"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("multilabel_oaa"))
    return nullptr;

  LEARNER::learner<multi_oaa, example>& l = LEARNER::init_learner(data, as_singleline(setup_base(options, all)),
      predict_or_learn<true>, predict_or_learn<false>, data->k, prediction_type::multilabels);
  l.set_finish_example(finish_example);
  all.p->lp = MULTILABEL::multilabel;
  all.label_type = label_type::multi;
  all.delete_prediction = MULTILABEL::multilabel.delete_label;

  return make_base(l);
}